

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

double NEST::NESTcalc::GetDriftVelocity_Liquid
                 (double Kelvin,double eField,double Density,double Bar,short StdDev)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ostream *poVar6;
  runtime_error *this;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  long lStack_a0;
  double local_90;
  
  bVar5 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (!bVar5) {
    if (StdDev < 1) {
      if (StdDev < 0) {
        if ((Kelvin < 100.0) || (230.0 < Kelvin)) {
          std::operator<<((ostream *)&std::cerr,
                          "\nWARNING: TEMPERATURE OUT OF RANGE (100-230 K) for vD\n");
          dVar16 = 100.0;
          if (100.0 <= Kelvin) {
            dVar16 = Kelvin;
          }
          Kelvin = 230.0;
          if (dVar16 <= 230.0) {
            Kelvin = dVar16;
          }
          std::operator<<((ostream *)&std::cerr,
                          "Using value at closest temp for a drift speed estimate\n");
        }
        if ((Kelvin < 100.0) || (lStack_a0 = 0, 120.0 <= Kelvin)) {
          if ((Kelvin < 120.0) || (140.0 <= Kelvin)) {
            if ((Kelvin < 140.0) || (155.0 <= Kelvin)) {
              if ((Kelvin < 155.0) || (157.0 <= Kelvin)) {
                if ((Kelvin < 157.0) || (163.0 <= Kelvin)) {
                  if ((Kelvin < 163.0) || (165.0 <= Kelvin)) {
                    if ((Kelvin < 165.0) || (167.0 <= Kelvin)) {
                      if ((Kelvin < 167.0) || (184.0 <= Kelvin)) {
                        if ((Kelvin < 184.0) || (200.0 <= Kelvin)) {
                          if ((Kelvin < 200.0) || (230.0 < Kelvin)) {
                            this = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (this,"ERROR: TEMPERATURE OUT OF RANGE (100-230 K)");
                            __cxa_throw(this,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          lStack_a0 = 9;
                        }
                        else {
                          lStack_a0 = 8;
                        }
                      }
                      else {
                        lStack_a0 = 7;
                      }
                    }
                    else {
                      lStack_a0 = 6;
                    }
                  }
                  else {
                    lStack_a0 = 5;
                  }
                }
                else {
                  lStack_a0 = 4;
                }
              }
              else {
                lStack_a0 = 3;
              }
            }
            else {
              lStack_a0 = 2;
            }
          }
          else {
            lStack_a0 = 1;
          }
        }
        uVar9 = (ulong)((int)lStack_a0 + 1);
        dVar16 = (double)(&DAT_00114d40)[lStack_a0];
        dVar15 = (double)(&DAT_00114d40)[uVar9];
        lVar11 = lStack_a0 * 0x38;
        dVar14 = -eField;
        dVar17 = exp(dVar14 / (double)(&DAT_00114ad8)[lStack_a0 * 7]);
        dVar2 = exp(dVar14 / *(double *)(&UNK_00114ae8 + lVar11));
        dVar1 = *(double *)(&UNK_00114ae0 + lVar11);
        dVar18 = *(double *)(&DAT_00114ad0 + lVar11);
        dVar3 = exp(dVar14 / *(double *)(&UNK_00114af8 + lVar11));
        dVar17 = dVar3 * *(double *)(&UNK_00114af0 + lVar11) + dVar17 * dVar18 + dVar2 * dVar1 +
                 *(double *)(&UNK_00114b00 + lVar11);
        lVar11 = uVar9 * 0x38;
        dVar2 = exp(dVar14 / (double)(&DAT_00114ad8)[uVar9 * 7]);
        dVar3 = exp(dVar14 / *(double *)(&UNK_00114ae8 + lVar11));
        dVar1 = *(double *)(&UNK_00114ae0 + lVar11);
        dVar18 = *(double *)(&DAT_00114ad0 + lVar11);
        dVar14 = exp(dVar14 / *(double *)(&UNK_00114af8 + lVar11));
        dVar1 = dVar14 * *(double *)(&UNK_00114af0 + lVar11) + dVar2 * dVar18 + dVar3 * dVar1 +
                *(double *)(&UNK_00114b00 + lVar11);
        bVar5 = ValidityTests::nearlyEqual(Kelvin,dVar16,1e-09);
        if (bVar5) {
          return dVar17;
        }
        bVar5 = ValidityTests::nearlyEqual(Kelvin,dVar15,1e-09);
        if (bVar5) {
          return dVar1;
        }
        dVar18 = dVar1 - dVar17;
        if (dVar17 <= dVar1) {
          dVar17 = dVar17 + (Kelvin - dVar16) * (dVar18 / (dVar15 - dVar16));
        }
        else {
          dVar14 = ((dVar15 * dVar18 - dVar18 * dVar16) + -4.0) * dVar18;
          if (dVar14 < 0.0) {
            dVar2 = sqrt(dVar14);
          }
          else {
            dVar2 = SQRT(dVar14);
          }
          dVar3 = dVar15 - dVar16;
          dVar21 = SQRT(dVar3);
          dVar19 = dVar21;
          if (dVar3 < 0.0) {
            dVar19 = sqrt(dVar3);
          }
          dVar22 = dVar21;
          if (dVar3 < 0.0) {
            dVar22 = sqrt(dVar3);
          }
          if (dVar3 < 0.0) {
            dVar21 = sqrt(dVar3);
          }
          auVar20._0_8_ = dVar19 * (dVar17 + dVar1) + dVar2;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          auVar20._8_8_ = 0x3ff0000000000000;
          auVar4._8_8_ = (dVar21 * dVar14 - (dVar16 + dVar15) * dVar18) / (dVar18 + dVar18) + Kelvin
          ;
          auVar4._0_8_ = dVar22 + dVar22;
          auVar20 = divpd(auVar20,auVar4);
          dVar17 = auVar20._8_8_ + auVar20._0_8_;
        }
        if (0.0 < dVar17) {
          return dVar17;
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "\nWARNING: DRIFT SPEED NON-POSITIVE. Setting to 0.1 mm/us\t");
        poVar6 = std::operator<<(poVar6,
                                 "Line Number ~1950 of NEST.cpp, in function NESTcalc::GetDriftVelocity_Liquid\t"
                                );
        std::operator<<(poVar6,
                        "Stop bothering Matthew about this, and fix underlying cause in your code!\n"
                       );
        pcVar8 = "Something unknown went wrong: are you in a noble element?? ";
        if (10000.0 < eField) {
          pcVar8 = "FIELD MAYBE TOO HIGH. ";
        }
        pcVar10 = "FIELD MAY BE TOO LOW. ";
        if (eField < 1.0) {
          pcVar10 = pcVar8;
        }
        if (100.0 <= eField) {
          pcVar10 = pcVar8;
        }
        std::operator<<((ostream *)&std::cerr,pcVar10);
        std::operator<<((ostream *)&std::cerr,"EF = ");
        poVar6 = std::ostream::_M_insert<double>(eField);
        std::operator<<(poVar6," V/cm. T = ");
        poVar6 = std::ostream::_M_insert<double>(Kelvin);
        poVar6 = std::operator<<(poVar6," Kelvin");
        std::endl<char,std::char_traits<char>>(poVar6);
        return 0.1;
      }
      dVar16 = pow(eField / 31.683,1.3237);
      dVar15 = 1.7681;
    }
    else {
      dVar16 = pow(eField / 30.0,1.3);
      dVar15 = 1.83;
    }
    return dVar15 - dVar15 / (dVar16 + 1.0);
  }
  if ((Kelvin < 84.0) || (140.0 < Kelvin)) {
    std::operator<<((ostream *)&std::cerr,"\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n")
    ;
    std::operator<<((ostream *)&std::cerr,"Using value at closest temp for a drift speed estimate\n"
                   );
    iVar7 = 0x54;
    if (0x54 < (int)Kelvin) {
      iVar7 = (int)Kelvin;
    }
    if (0x8b < iVar7) {
      iVar7 = 0x8c;
    }
    Kelvin = (double)iVar7;
  }
  if ((Kelvin < 85.0) || (86.0 <= Kelvin)) {
    if ((Kelvin < 86.0) || (88.0 <= Kelvin)) {
      if ((Kelvin < 88.0) || (92.0 <= Kelvin)) {
        if ((Kelvin < 92.0) || (96.0 <= Kelvin)) {
          if ((Kelvin < 96.0) || (110.0 <= Kelvin)) {
            if ((Kelvin < 110.0) || (125.0 <= Kelvin)) {
              uVar12 = 0;
              uVar13 = 0;
              if ((Kelvin < 125.0) || (140.0 < Kelvin)) goto LAB_0010e8bc;
              local_90 = -0.03558428 / (eField / 1000.0) + 0.24207633;
              dVar16 = log(eField / 1000.0);
              dVar16 = dVar16 * 0.33645519;
            }
            else {
              local_90 = -0.06644517 / (eField / 1000.0) + 0.502022794;
              dVar16 = log(eField / 1000.0);
              dVar16 = dVar16 * 0.3290246;
            }
          }
          else {
            local_90 = -0.0731659 / (eField / 1000.0) + 0.76551511;
            dVar16 = log(eField / 1000.0);
            dVar16 = dVar16 * 0.317972;
          }
        }
        else {
          local_90 = -0.092997 / (eField / 1000.0) + 0.6911897;
          dVar16 = log(eField / 1000.0);
          dVar16 = dVar16 * 0.3295202;
        }
      }
      else {
        local_90 = -0.0990952 / (eField / 1000.0) + 0.7795972;
        dVar16 = log(eField / 1000.0);
        dVar16 = dVar16 * 0.320876;
      }
    }
    else {
      local_90 = -0.06694564 / (eField / 1000.0) + 0.80302379;
      dVar16 = log(eField / 1000.0);
      dVar16 = dVar16 * 0.331798;
    }
  }
  else {
    local_90 = -0.0734108 / (eField / 1000.0) + 0.937729;
    dVar16 = log(eField / 1000.0);
    dVar16 = dVar16 * 0.315338;
  }
  dVar16 = exp(dVar16 + local_90);
  uVar12 = SUB84(dVar16,0);
  uVar13 = (undefined4)((ulong)dVar16 >> 0x20);
LAB_0010e8bc:
  dVar16 = 0.0;
  if (0.0 <= (double)CONCAT44(uVar13,uVar12)) {
    dVar16 = (double)CONCAT44(uVar13,uVar12);
  }
  return dVar16;
}

Assistant:

double NESTcalc::GetDriftVelocity_Liquid(double Kelvin, double eField, double Density,
                                         double Bar, short int StdDev) {
  // for liquid and solid only. Density and purity dependencies to be
  // added in the future.

  double speed =
      0.0;  // returns drift speed in mm/usec. based on Fig. 14 arXiv:1712.08607
  int i, j;
  double vi, vf, slope, Ti, Tf, offset;

  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // replace eventually with Kate's work, once T's splined as done for LXe and
    // SXe
    /*x_nest is field in kV/cm:
    Liquid:
    y_nest_85 = 2.553969*(0.929235**(1/x_nest))*x_nest**0.315673 // temperatures
    in Kelvin y_nest_87 = 2.189388*(0.961701**(1/x_nest))*x_nest**0.339414
    y_nest_89 = 2.201489*(0.931080**(1/x_nest))*x_nest**0.320762
    y_nest_94 = 1.984534*(0.936081**(1/x_nest))*x_nest**0.332491
    y_nest_100 = 2.150101*(0.929447**(1/x_nest))*x_nest**0.317973
    y_nest_120 = 1.652059*(0.935714**(1/x_nest))*x_nest**0.329025
    y_nest_130 = 1.273891*(0.965041**(1/x_nest))*x_nest**0.336455
    Solid:
    y_nest_80 = 7.063288*(0.929753**(1/x_nest))*x_nest**0.314640
    y_nest_82 = 5.093097*(0.920459**(1/x_nest))*x_nest**0.458724*/
    double Temperature[8] = {85., 86., 88., 92., 96., 110., 125., 140.};

    if (Kelvin < 84. || Kelvin > 140.) {
      cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n";
      cerr << "Using value at closest temp for a drift speed estimate\n";
      Kelvin = (double)NESTcalc::clamp(int(Kelvin), 84, 140);
    }
	//if (Kelvin==89) speed =  2.201489*pow(0.931080,1/(eField/1000))*pow((eField/1000), 0.320762);
   if (Kelvin >= Temperature[0] && Kelvin < Temperature[1])
      speed = exp(0.937729 - 0.0734108 / (eField / 1000) +
                  0.315338 * log(eField / 1000));
    else if (Kelvin >= Temperature[1] && Kelvin < Temperature[2])
      speed = exp(0.80302379 - 0.06694564 / (eField / 1000) +
                  0.331798 * log(eField / 1000));
    else if (Kelvin >= Temperature[2] && Kelvin < Temperature[3])
      speed = exp(0.7795972 - 0.0990952 / (eField / 1000) +
                  0.320876 * log(eField / 1000));
    else if (Kelvin >= Temperature[3] && Kelvin < Temperature[4])
      speed = exp(0.6911897 - 0.092997 / (eField / 1000) +
                  0.3295202 * log(eField / 1000));
    else if (Kelvin >= Temperature[4] && Kelvin < Temperature[5])
      speed = exp(0.76551511 - 0.0731659 / (eField / 1000) +
                  0.317972 * log(eField / 1000));
    else if (Kelvin >= Temperature[5] && Kelvin < Temperature[6])
      speed = exp(0.502022794 - 0.06644517 / (eField / 1000) +
                  0.3290246 * log(eField / 1000));
    else if (Kelvin >= Temperature[6] && Kelvin <= Temperature[7])
      speed = exp(0.24207633 - 0.03558428 / (eField / 1000) +
                  0.33645519 * log(eField / 1000));

    if (speed < 0.) speed = 0.;
    return speed;
  }

  if (StdDev >= 1)
    return 1.83 - 1.83 / (1. + pow(eField / 30., 1.3));  // eF<260V/cm
  if (StdDev >= 0) return 1.7681 - 1.7681 / (1. + pow(eField / 31.683, 1.3237));

  double polyExp[11][7] = {
      {-3.1046, 27.037, -2.1668, 193.27, -4.8024, 646.04, 9.2471},  // 100K
      {-2.7394, 22.760, -1.7775, 222.72, -5.0836, 724.98, 8.7189},  // 120
      {-2.3646, 164.91, -1.6984, 21.473, -4.4752, 1202.2, 7.9744},  // 140
      {-1.8097, 235.65, -1.7621, 36.855, -3.5925, 1356.2, 6.7865},  // 155
      {-1.5000, 37.021, -1.1430, 6.4590, -4.0337, 855.43,
       5.4238},  // 157, merging Miller with Yoo
      {-1.4939, 47.879, 0.12608, 8.9095, -1.3480, 1310.9,
       2.7598},  // 163, merging Miller with Yoo
      {-1.5389, 26.602, -.44589, 196.08, -1.1516, 1810.8, 2.8912},  // 165
      {-1.5000, 28.510, -.21948, 183.49, -1.4320, 1652.9, 2.884},   // 167
      {-1.1781, 49.072, -1.3008, 3438.4, -.14817, 312.12, 2.8049},  // 184
      {1.2466, 85.975, -.88005, 918.57, -3.0085, 27.568, 2.3823},   // 200
      {334.60, 37.556, 0.92211, 345.27, -338.00, 37.346, 1.9834}};  // 230

  double Temperatures[11] = {100., 120., 140., 155., 157., 163.,
                             165., 167., 184., 200., 230.};

  if (Kelvin < 100. || Kelvin > 230.) {
    cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (100-230 K) for vD\n";
    if (Kelvin < 100.) Kelvin = 100.;
    if (Kelvin > 230.) Kelvin = 230.;
    cerr << "Using value at closest temp for a drift speed estimate\n";
  }

  if (Kelvin >= Temperatures[0] && Kelvin < Temperatures[1])
    i = 0;
  else if (Kelvin >= Temperatures[1] && Kelvin < Temperatures[2])
    i = 1;
  else if (Kelvin >= Temperatures[2] && Kelvin < Temperatures[3])
    i = 2;
  else if (Kelvin >= Temperatures[3] && Kelvin < Temperatures[4])
    i = 3;
  else if (Kelvin >= Temperatures[4] && Kelvin < Temperatures[5])
    i = 4;
  else if (Kelvin >= Temperatures[5] && Kelvin < Temperatures[6])
    i = 5;
  else if (Kelvin >= Temperatures[6] && Kelvin < Temperatures[7])
    i = 6;
  else if (Kelvin >= Temperatures[7] && Kelvin < Temperatures[8])
    i = 7;
  else if (Kelvin >= Temperatures[8] && Kelvin < Temperatures[9])
    i = 8;
  else if (Kelvin >= Temperatures[9] && Kelvin <= Temperatures[10])
    i = 9;
  else {
    throw std::runtime_error("ERROR: TEMPERATURE OUT OF RANGE (100-230 K)");
  }

  j = i + 1;
  Ti = Temperatures[i];
  Tf = Temperatures[j];
  // functional form from http://zunzun.com
  vi = polyExp[i][0] * exp(-eField / polyExp[i][1]) +
       polyExp[i][2] * exp(-eField / polyExp[i][3]) +
       polyExp[i][4] * exp(-eField / polyExp[i][5]) + polyExp[i][6];
  vf = polyExp[j][0] * exp(-eField / polyExp[j][1]) +
       polyExp[j][2] * exp(-eField / polyExp[j][3]) +
       polyExp[j][4] * exp(-eField / polyExp[j][5]) + polyExp[j][6];
  if (ValidityTests::nearlyEqual(Kelvin, Ti)) return vi;
  if (ValidityTests::nearlyEqual(Kelvin, Tf)) return vf;
  if (vf < vi) {
    offset = (sqrt((Tf * (vf - vi) - Ti * (vf - vi) - 4.) * (vf - vi)) +
              sqrt(Tf - Ti) * (vf + vi)) /
             (2. * sqrt(Tf - Ti));
    slope = -(sqrt(Tf - Ti) *
                  sqrt((Tf * (vf - vi) - Ti * (vf - vi) - 4.) * (vf - vi)) -
              (Tf + Ti) * (vf - vi)) /
            (2. * (vf - vi));
    speed = 1. / (Kelvin - slope) + offset;
  } else {
    slope = (vf - vi) / (Tf - Ti);
    speed = slope * (Kelvin - Ti) + vi;
  }

  if (speed <= 0.) {
    cerr << "\nWARNING: DRIFT SPEED NON-POSITIVE. Setting to 0.1 mm/us\t"
         << "Line Number ~1950 of NEST.cpp, in function "
            "NESTcalc::GetDriftVelocity_Liquid\t"
         << "Stop bothering Matthew about this, and fix underlying cause in "
            "your code!\n";
    if (eField < 1e2 && eField >= FIELD_MIN) {
      cerr << "FIELD MAY BE TOO LOW. ";
    } else if (eField > 1e4) {
      cerr << "FIELD MAYBE TOO HIGH. ";
    } else {
      cerr << "Something unknown went wrong: are you in a noble element?? ";
    }
    cerr << "EF = " << eField << " V/cm. T = " << Kelvin << " Kelvin" << endl;
    speed = 0.1;
  }
  return speed;  // mm per microsecond
}